

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_read_uint32(void *a,uint32_t **attrib,trico_stream_type st)

{
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  uint8_t *__ptr_01;
  uint32_t uVar1;
  ssize_t sVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_of_attribs;
  uint8_t *local_58;
  char *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  iVar5 = 0;
  if (*(trico_stream_type *)((long)a + 0x24) == st) {
    sVar2 = read((int)&nr_of_attribs,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      iVar5 = 0;
    }
    else {
      sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
      uVar1 = nr_of_compressed_bytes;
      iVar4 = 0;
      iVar5 = 0;
      if ((int)sVar2 != 0) {
        uVar6 = (ulong)nr_of_compressed_bytes;
        pcVar3 = (char *)malloc(uVar6);
        sVar2 = read((int)pcVar3,(void *)0x1,uVar6);
        iVar5 = iVar4;
        if ((int)sVar2 != 0) {
          uVar6 = (ulong)nr_of_attribs;
          local_38 = (uint8_t *)malloc(uVar6);
          uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_38,uVar1,nr_of_attribs);
          if (uVar1 != nr_of_attribs) {
            __assert_fail("bytes_decompressed == nr_of_attribs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                          ,0x5e6,
                          "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)");
          }
          sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
          uVar1 = nr_of_compressed_bytes;
          if ((int)sVar2 != 0) {
            uVar7 = (ulong)nr_of_compressed_bytes;
            pcVar3 = (char *)realloc(pcVar3,uVar7);
            sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
            if ((int)sVar2 != 0) {
              local_40 = (uint8_t *)malloc(uVar6);
              uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_40,uVar1,nr_of_attribs);
              if (uVar1 != nr_of_attribs) {
                __assert_fail("bytes_decompressed == nr_of_attribs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x5ef,
                              "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)");
              }
              sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
              uVar1 = nr_of_compressed_bytes;
              if ((int)sVar2 != 0) {
                uVar7 = (ulong)nr_of_compressed_bytes;
                pcVar3 = (char *)realloc(pcVar3,uVar7);
                sVar2 = read((int)pcVar3,(void *)0x1,uVar7);
                if ((int)sVar2 != 0) {
                  local_48 = (uint8_t *)malloc(uVar6);
                  uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_48,uVar1,nr_of_attribs);
                  if (uVar1 != nr_of_attribs) {
                    __assert_fail("bytes_decompressed == nr_of_attribs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                  ,0x5f8,
                                  "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                 );
                  }
                  sVar2 = read((int)&nr_of_compressed_bytes,(void *)0x4,1);
                  if ((int)sVar2 != 0) {
                    pcVar3 = (char *)realloc(pcVar3,(ulong)nr_of_compressed_bytes);
                    sVar2 = read((int)pcVar3,(void *)0x1,(ulong)nr_of_compressed_bytes);
                    if ((int)sVar2 != 0) {
                      local_58 = (uint8_t *)malloc(uVar6);
                      local_50 = pcVar3;
                      uVar1 = LZ4_decompress_safe(pcVar3,(char *)local_58,nr_of_compressed_bytes,
                                                  nr_of_attribs);
                      __ptr_01 = local_38;
                      __ptr_00 = local_40;
                      __ptr = local_48;
                      if (uVar1 != nr_of_attribs) {
                        __assert_fail("bytes_decompressed == nr_of_attribs",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x601,
                                      "int trico_read_uint32(void *, uint32_t **, enum trico_stream_type)"
                                     );
                      }
                      if (attrib != (uint32_t **)0x0) {
                        trico_transpose_uint32_soa_to_aos
                                  (attrib,local_38,local_40,local_48,local_58,nr_of_attribs);
                      }
                      free(local_50);
                      free(__ptr_01);
                      free(__ptr_00);
                      free(__ptr);
                      free(local_58);
                      read_next_stream_type((trico_archive *)a);
                      iVar5 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int trico_read_uint32(void* a, uint32_t** attrib, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_of_attribs;
  if (!read(&nr_of_attribs, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b1 = (uint8_t*)trico_malloc(nr_of_attribs);
  uint32_t bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b1, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b2 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b2, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b3 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b3, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint8_t* decompressed_b4 = (uint8_t*)trico_malloc(nr_of_attribs);
  bytes_decompressed = (uint32_t)LZ4_decompress_safe((const char*)compressed, (char*)decompressed_b4, nr_of_compressed_bytes, nr_of_attribs);
  assert(bytes_decompressed == nr_of_attribs);

  if (attrib != NULL)
    trico_transpose_uint32_soa_to_aos(attrib, decompressed_b1, decompressed_b2, decompressed_b3, decompressed_b4, nr_of_attribs);

  trico_free(compressed);
  trico_free(decompressed_b1);
  trico_free(decompressed_b2);
  trico_free(decompressed_b3);
  trico_free(decompressed_b4);

  read_next_stream_type(arch);

  return 1;
  }